

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QModelIndex> * __thiscall
QList<QModelIndex>::operator+=(QList<QModelIndex> *this,QList<QModelIndex> *l)

{
  QModelIndex *pQVar1;
  Data *pDVar2;
  QModelIndex *pQVar3;
  QModelIndex *pQVar4;
  quintptr qVar5;
  int iVar6;
  QModelIndex *pQVar7;
  long lVar8;
  
  lVar8 = (l->d).size;
  if (lVar8 != 0) {
    pDVar2 = (l->d).d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      pQVar3 = (l->d).ptr;
      QtPrivate::QCommonArrayOps<QModelIndex>::growAppend
                ((QCommonArrayOps<QModelIndex> *)this,pQVar3,pQVar3 + lVar8);
    }
    else {
      QArrayDataPointer<QModelIndex>::detachAndGrow
                (&this->d,GrowsAtEnd,lVar8,(QModelIndex **)0x0,(QArrayDataPointer<QModelIndex> *)0x0
                );
      lVar8 = (l->d).size;
      if ((lVar8 != 0) && (0 < lVar8)) {
        pQVar7 = (l->d).ptr;
        pQVar3 = pQVar7 + lVar8;
        pQVar4 = (this->d).ptr;
        lVar8 = (this->d).size;
        do {
          pQVar4[lVar8].m.ptr = (pQVar7->m).ptr;
          iVar6 = pQVar7->c;
          qVar5 = pQVar7->i;
          pQVar1 = pQVar4 + lVar8;
          pQVar1->r = pQVar7->r;
          pQVar1->c = iVar6;
          pQVar1->i = qVar5;
          pQVar7 = pQVar7 + 1;
          lVar8 = (this->d).size + 1;
          (this->d).size = lVar8;
        } while (pQVar7 < pQVar3);
      }
    }
  }
  return this;
}

Assistant:

QList<T> &operator+=(QList<T> &&l) { append(std::move(l)); return *this; }